

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seqmap.c
# Opt level: O1

void seqmap_free(seqmap_t *map)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  bool bVar5;
  long lVar4;
  
  if (map != (seqmap_t *)0x0) {
    sVar2 = map->len;
    lVar4 = sVar2 << 4;
    while( true ) {
      lVar3 = lVar4 + -0x10;
      if (sVar2 == 0) {
        lVar1 = 0;
      }
      else {
        lVar1 = (long)&map->ptr[-1].key + lVar4;
      }
      bVar5 = sVar2 == 0;
      sVar2 = sVar2 - 1;
      if (bVar5) break;
      lVar4 = lVar3;
      if ((*(byte *)(lVar1 + 4) & 1) != 0) {
        free(*(void **)(lVar1 + 8));
      }
    }
    free(map->ptr);
    free(map);
    return;
  }
  return;
}

Assistant:

void
seqmap_free(
    seqmap_t *map)
{
    if (!map)
        return;
    seqmap_entry_t *ent;
    seqmap_for_each(map, ent)
        if (ent->flags & SEQMAP_FLAG_ALLOC)
            free(ent->value);
    free(map->ptr);
    free(map);
}